

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O0

MIR_type_t get_blk_type(int n_qwords,MIR_type_t *qword_types)

{
  MIR_type_t MVar1;
  int local_24;
  int local_20;
  int n_fregs;
  int n_iregs;
  int n;
  MIR_type_t *qword_types_local;
  int n_qwords_local;
  
  local_20 = 0;
  local_24 = 0;
  if (2 < n_qwords) {
    __assert_fail("n_qwords <= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                  ,0x14e,"MIR_type_t get_blk_type(int, MIR_type_t *)");
  }
  if (n_qwords == 0) {
    qword_types_local._4_4_ = MIR_T_BLK;
  }
  else {
    for (n_fregs = 0; n_fregs < n_qwords; n_fregs = n_fregs + 1) {
      MVar1 = qword_types[n_fregs];
      if ((((MVar1 == MIR_T_I8) || (MVar1 == MIR_T_I16)) || (MVar1 == MIR_T_I32)) ||
         (MVar1 == MIR_T_I64)) {
        local_20 = local_20 + 1;
      }
      else {
        if (1 < MVar1 - MIR_T_F) {
          if ((MVar1 != MIR_T_LD) && (MVar1 != 0x15)) {
            __assert_fail("FALSE",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/x86_64/cx86_64-ABI-code.c"
                          ,0x15a,"MIR_type_t get_blk_type(int, MIR_type_t *)");
          }
          return MIR_T_BLK;
        }
        local_24 = local_24 + 1;
      }
    }
    if (local_20 == n_qwords) {
      qword_types_local._4_4_ = MIR_T_BLK|MIR_T_U8;
    }
    else if (local_24 == n_qwords) {
      qword_types_local._4_4_ = MIR_T_BLK|MIR_T_I16;
    }
    else if ((*qword_types == MIR_T_F) || (*qword_types == MIR_T_D)) {
      qword_types_local._4_4_ = 0x10;
    }
    else {
      qword_types_local._4_4_ = MIR_T_BLK|MIR_T_U16;
    }
  }
  return qword_types_local._4_4_;
}

Assistant:

static MIR_type_t get_blk_type (int n_qwords, MIR_type_t *qword_types) {
  int n, n_iregs = 0, n_fregs = 0;

  assert (n_qwords <= 2);
  if (n_qwords == 0) return MIR_T_BLK;
  for (n = 0; n < n_qwords; n++) { /* start from the last qword */
    switch ((int) qword_types[n]) {
    case MIR_T_I8:
    case MIR_T_I16:
    case MIR_T_I32:
    case MIR_T_I64: n_iregs++; break;
    case MIR_T_F:
    case MIR_T_D: n_fregs++; break;
    case X87UP_CLASS:
    case MIR_T_LD: return MIR_T_BLK;
    default: assert (FALSE);
    }
  }
  if (n_iregs == n_qwords) return MIR_T_BLK + 1;
  if (n_fregs == n_qwords) return MIR_T_BLK + 2;
  if (qword_types[0] == MIR_T_F || qword_types[0] == MIR_T_D) return MIR_T_BLK + 4;
  return MIR_T_BLK + 3;
}